

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filewatcher.cpp
# Opt level: O1

void FileWatcherAddWatch(HFileWatcher handle,char *watch)

{
  pthread_mutex_t *__mutex;
  int iVar1;
  __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  _Var2;
  undefined8 uVar3;
  allocator<char> local_39;
  char *local_38;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_30;
  
  __mutex = (pthread_mutex_t *)((long)handle + 0x38);
  local_38 = watch;
  iVar1 = pthread_mutex_lock(__mutex);
  if (iVar1 == 0) {
    _Var2 = std::
            __find_if<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>,__gnu_cxx::__ops::_Iter_equals_val<char_const*const>>
                      (*(undefined8 *)((long)handle + 0x10),*(undefined8 *)((long)handle + 0x18),
                       &local_38);
    if (_Var2._M_current ==
        *(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> **)((long)handle + 0x18)
       ) {
      std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,local_38,&local_39);
      std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
      emplace_back<std::__cxx11::string>
                ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)
                 ((long)handle + 0x10),&local_30);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_30._M_dataplus._M_p != &local_30.field_2) {
        operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
      }
    }
    pthread_mutex_unlock(__mutex);
    return;
  }
  uVar3 = std::__throw_system_error(iVar1);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_30._M_dataplus._M_p != &local_30.field_2) {
    operator_delete(local_30._M_dataplus._M_p,local_30.field_2._M_allocated_capacity + 1);
  }
  pthread_mutex_unlock(__mutex);
  _Unwind_Resume(uVar3);
}

Assistant:

void FileWatcherAddWatch(HFileWatcher handle, const char* watch) {
    FileWatcher* watcher = (FileWatcher*)handle;
    std::lock_guard<std::mutex> guard(watcher->Mutex);
    auto it = std::find(watcher->Watches.begin(), watcher->Watches.end(), watch);
    if (it == watcher->Watches.end()) {
        watcher->Watches.push_back(std::string(watch));
    }
}